

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocaleData::applyIntegerFormatting
          (QString *__return_storage_ptr__,QLocaleData *this,QString *numStr,bool negative,
          int precision,int base,int width,uint flags)

{
  uint uVar1;
  qsizetype qVar2;
  Data *pDVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  qsizetype i_1;
  undefined1 *puVar8;
  char16_t *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  QString local_c8;
  QStringBuilder<QString,_const_QStringView_&> local_a8;
  QString local_88;
  QStringView local_68;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (base == 10) {
    local_58.d.size = (qsizetype)this->m_zero_size;
    if (local_58.d.size == 0) {
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.size = 0;
    }
    else {
      local_58.d.ptr =
           L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
           + this->m_zero_idx;
    }
  }
  else {
    local_58.d.ptr = L"0";
    local_58.d.size = 1;
  }
  qVar2 = local_58.d.size;
  local_58.d.d = (Data *)0x0;
  uVar7 = (ulong)(numStr->d).size / (ulong)local_58.d.size;
  local_68.m_size = 0;
  local_68.m_data = &((QChar *)0x0)->ucs;
  if (-1 < (char)flags) goto LAB_00157487;
  if (base == 2) {
    local_68.m_data = L"0B";
    if ((flags >> 8 & 1) == 0) {
      local_68.m_data = L"0b";
    }
    local_68.m_size = 0;
    do {
      if (((QChar *)local_68.m_data)[local_68.m_size].ucs == L'\0') goto LAB_00157487;
      local_68.m_size = local_68.m_size + 1;
    } while (local_68.m_size != 3);
  }
  else {
    if (base == 8) {
      bVar5 = QString::startsWith(numStr,&local_58,CaseSensitive);
      local_68.m_size = 0;
      local_68.m_data = &((QChar *)0x0)->ucs;
      if (!bVar5) {
        local_68.m_size = local_58.d.size;
        local_68.m_data = local_58.d.ptr;
      }
      goto LAB_00157487;
    }
    local_68.m_size = 0;
    local_68.m_data = &((QChar *)0x0)->ucs;
    if (base != 0x10) goto LAB_00157487;
    local_68.m_data = L"0X";
    if ((flags >> 8 & 1) == 0) {
      local_68.m_data = L"0x";
    }
    local_68.m_size = 0;
    do {
      if (((QChar *)local_68.m_data)[local_68.m_size].ucs == L'\0') goto LAB_00157487;
      local_68.m_size = local_68.m_size + 1;
    } while (local_68.m_size != 3);
  }
  local_68.m_size = 3;
LAB_00157487:
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d._0_4_ = 0xaaaaaaaa;
  local_88.d.d._4_4_ = 0xaaaaaaaa;
  local_88.d.ptr._0_4_ = 0xaaaaaaaa;
  local_88.d.ptr._4_4_ = 0xaaaaaaaa;
  signPrefix(&local_c8,this,negative,flags);
  local_a8.a.d.size = local_c8.d.size;
  local_a8.a.d.ptr = local_c8.d.ptr;
  local_a8.a.d.d = local_c8.d.d;
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  local_a8.b = &local_68;
  QStringBuilder<QString,_const_QStringView_&>::convertTo<QString>(&local_88,&local_a8);
  if (&(local_a8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  puVar8 = (undefined1 *)(local_88.d.size + uVar7);
  if ((flags & 0x20) != 0 && base == 10) {
    uVar1 = *(uint *)&this->field_0x78;
    lVar11 = uVar7 - (uVar1 >> 0x13 & 7);
    if ((long)(ulong)(uVar1 >> 0xe & 3) <= lVar11) {
      uVar13 = (ulong)(uVar1 >> 0x10 & 7);
      uVar7 = (ulong)this->m_groupDelim_size;
      if (uVar7 == 0) {
        pcVar9 = L"";
      }
      else {
        pcVar9 = L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                 + this->m_groupDelim_idx;
      }
      QString::insert(numStr,lVar11 * qVar2,(QChar *)pcVar9,uVar7);
      puVar8 = puVar8 + 1;
      lVar12 = lVar11 - uVar13;
      if (lVar12 != 0 && (long)uVar13 <= lVar11) {
        do {
          QString::insert(numStr,lVar12 * qVar2,(QChar *)pcVar9,uVar7);
          puVar8 = puVar8 + 1;
          lVar11 = lVar12 - uVar13;
          bVar5 = (long)uVar13 <= lVar12;
          lVar12 = lVar11;
        } while (lVar11 != 0 && bVar5);
      }
    }
  }
  iVar6 = 1;
  if (precision != -1) {
    iVar6 = precision;
  }
  lVar11 = (numStr->d).size;
  lVar12 = (long)iVar6;
  lVar10 = lVar12 - lVar11;
  if (lVar10 != 0 && lVar11 <= lVar12) {
    do {
      pcVar9 = local_58.d.ptr;
      if ((QChar *)local_58.d.ptr == (QChar *)0x0) {
        pcVar9 = L"";
      }
      QString::insert(numStr,0,(QChar *)pcVar9,local_58.d.size);
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
    puVar8 = puVar8 + (lVar12 - lVar11);
  }
  if ((flags & 6) == 2 && precision == -1) {
    for (; (long)puVar8 < (long)width; puVar8 = puVar8 + 1) {
      pcVar9 = local_58.d.ptr;
      if ((QChar *)local_58.d.ptr == (QChar *)0x0) {
        pcVar9 = L"";
      }
      QString::insert(numStr,0,(QChar *)pcVar9,local_58.d.size);
    }
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if ((flags & 0x40) == 0) {
    pDVar3 = (numStr->d).d;
    pcVar9 = (numStr->d).ptr;
    (numStr->d).d = (Data *)0x0;
    (numStr->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = pcVar9;
    qVar2 = (numStr->d).size;
    (numStr->d).size = 0;
    (__return_storage_ptr__->d).size = qVar2;
  }
  else {
    QString::toUpper_helper(__return_storage_ptr__,numStr);
  }
  if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
    pcVar9 = (char16_t *)CONCAT44(local_88.d.ptr._4_4_,local_88.d.ptr._0_4_);
    if ((QChar *)pcVar9 == (QChar *)0x0) {
      pcVar9 = L"";
    }
    QString::insert(__return_storage_ptr__,0,(QChar *)pcVar9,local_88.d.size);
  }
  piVar4 = (int *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_88.d.d._4_4_,local_88.d.d._0_4_),2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocaleData::applyIntegerFormatting(QString &&numStr, bool negative, int precision,
                                            int base, int width, unsigned flags) const
{
    const QString zero = base == 10 ? zeroDigit() : QStringLiteral("0");
    const auto digitWidth = zero.size();
    const auto digitCount = numStr.size() / digitWidth;

    const auto basePrefix = [&] () -> QStringView {
        if (flags & ShowBase) {
            const bool upper = flags & UppercaseBase;
            if (base == 16)
                return upper ? u"0X" : u"0x";
            if (base == 2)
                return upper ? u"0B" : u"0b";
            if (base == 8 && !numStr.startsWith(zero))
                return zero;
        }
        return {};
    }();

    const QString prefix = signPrefix(negative, flags) + basePrefix;
    // Count how much of width we've used up.  Each digit counts as one
    qsizetype usedWidth = digitCount + prefix.size();

    if (base == 10 && flags & GroupDigits) {
        const QLocaleData::GroupSizes grouping = groupSizes();
        const QString group = groupSeparator();
        qsizetype i = digitCount - grouping.least;
        if (i >= grouping.first) {
            numStr.insert(i * digitWidth, group);
            ++usedWidth;
            while ((i -= grouping.higher) > 0) {
                numStr.insert(i * digitWidth, group);
                ++usedWidth;
            }
        }
        // TODO: should we group any zero-padding we add later ?
    }

    const bool noPrecision = precision == -1;
    if (noPrecision)
        precision = 1;

    for (qsizetype i = numStr.size(); i < precision; ++i) {
        numStr.prepend(zero);
        usedWidth++;
    }

    // LeftAdjusted overrides ZeroPadded; and sprintf() only pads when
    // precision is not specified in the format string.
    if (noPrecision && flags & ZeroPadded && !(flags & LeftAdjusted)) {
        for (qsizetype i = usedWidth; i < width; ++i)
            numStr.prepend(zero);
    }

    QString result(flags & CapitalEorX ? std::move(numStr).toUpper() : std::move(numStr));
    if (prefix.size())
        result.prepend(prefix);
    return result;
}